

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

MessageOptions * __thiscall
google::protobuf::DescriptorProto::_internal_mutable_options(DescriptorProto *this)

{
  MessageOptions *pMVar1;
  Arena *arena;
  
  pMVar1 = (this->field_0)._impl_.options_;
  if (pMVar1 != (MessageOptions *)0x0) {
    return pMVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pMVar1 = (MessageOptions *)Arena::DefaultConstruct<google::protobuf::MessageOptions>(arena);
  (this->field_0)._impl_.options_ = pMVar1;
  return pMVar1;
}

Assistant:

inline ::google::protobuf::MessageOptions* PROTOBUF_NONNULL DescriptorProto::_internal_mutable_options() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.options_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::MessageOptions>(GetArena());
    _impl_.options_ = reinterpret_cast<::google::protobuf::MessageOptions*>(p);
  }
  return _impl_.options_;
}